

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void ucnv_cbFromUWriteBytes_63
               (UConverterFromUnicodeArgs *args,char *source,int32_t length,int32_t offsetIndex,
               UErrorCode *err)

{
  if (U_ZERO_ERROR < *err) {
    return;
  }
  ucnv_fromUWriteBytes_63
            (args->converter,source,length,&args->target,args->targetLimit,&args->offsets,
             offsetIndex,err);
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }